

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

bool __thiscall QPDF::findHeader(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  OffsetInputSource *pOVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  long global_offset;
  logic_error *this_01;
  char *p;
  string version;
  string line;
  shared_ptr<InputSource> local_98;
  OffsetInputSource *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  char *local_78;
  string local_70;
  string local_50;
  
  global_offset =
       (**(code **)(**(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> + 0x20
                   ))();
  InputSource::readLine_abi_cxx11_
            (&local_50,
             (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x400);
  _Var4._M_p = local_50._M_dataplus._M_p;
  local_78 = local_50._M_dataplus._M_p;
  iVar6 = strncmp(local_50._M_dataplus._M_p,"%PDF-",5);
  if (iVar6 == 0) {
    local_78 = _Var4._M_p + 5;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    bVar5 = validatePDFVersion(&local_78,&local_70);
    if (bVar5) {
      std::__cxx11::string::_M_assign
                ((string *)
                 &((this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pdf_version);
      if (global_offset != 0) {
        local_88 = (OffsetInputSource *)operator_new(200);
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((_Var1._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->file + 8))
             ->_M_pi;
        if (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        OffsetInputSource::OffsetInputSource(local_88,&local_98,global_offset);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<OffsetInputSource*>
                  (&_Stack_80,local_88);
        _Var3._M_pi = _Stack_80._M_pi;
        pOVar2 = local_88;
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        local_88 = (OffsetInputSource *)0x0;
        _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00._M_pi =
             ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->file + 8))
             ->_M_pi;
        *(OffsetInputSource **)
         &((_Var1._M_head_impl)->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> =
             pOVar2;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->file + 8))->
        _M_pi = _Var3._M_pi;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
        }
        if (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return bVar5;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"findHeader is not looking at %PDF-");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
QPDF::findHeader()
{
    qpdf_offset_t global_offset = m->file->tell();
    std::string line = m->file->readLine(1024);
    char const* p = line.c_str();
    if (strncmp(p, "%PDF-", 5) != 0) {
        throw std::logic_error("findHeader is not looking at %PDF-");
    }
    p += 5;
    std::string version;
    // Note: The string returned by line.c_str() is always null-terminated. The code below never
    // overruns the buffer because a null character always short-circuits further advancement.
    bool valid = validatePDFVersion(p, version);
    if (valid) {
        m->pdf_version = version;
        if (global_offset != 0) {
            // Empirical evidence strongly suggests that when there is leading material prior to the
            // PDF header, all explicit offsets in the file are such that 0 points to the beginning
            // of the header.
            QTC::TC("qpdf", "QPDF global offset");
            m->file = std::shared_ptr<InputSource>(new OffsetInputSource(m->file, global_offset));
        }
    }
    return valid;
}